

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseLocator_test.cpp
# Opt level: O2

void __thiscall
test::environment_var_location_not_defined::test_method(environment_var_location_not_defined *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  long local_1c0 [2];
  shared_count sStack_1b0;
  undefined4 local_1a4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseInfos;
  undefined **local_188;
  undefined1 local_180;
  undefined1 *local_178;
  char *local_170;
  EnvironmentVarLocation environmentVarLocation;
  EventRegistry registry;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  unsetenv("LICENSE_LOCATION");
  license::EventRegistry::EventRegistry(&registry);
  license::locate::EnvironmentVarLocation::EnvironmentVarLocation(&environmentVarLocation);
  license::locate::EnvironmentVarLocation::license_locations_abi_cxx11_
            (&licenseInfos,&environmentVarLocation,&registry);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xb6);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_1c0[1] = 0;
  sStack_1b0.pi_ = (sp_counted_base *)0x0;
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_001e2290;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = "No fatal error for now, only warnings";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_58 = "";
  local_1c0[0]._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1b0);
  license::EventRegistry::turnWarningsIntoErrors(&registry);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xb8);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_1c0[0] = CONCAT71(local_1c0[0]._1_7_,!bVar1);
  local_1c0[1] = 0;
  sStack_1b0.pi_ = (sp_counted_base *)0x0;
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_001e22d0;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = "Error detected";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion(local_1c0,&local_188,&local_90,0xb8,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_1b0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xb9);
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_001e2150;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_b8 = "";
  local_1a4 = 0;
  local_1c0[0] = (long)licenseInfos.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)licenseInfos.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (&local_188,&local_c0,0xb9,1,2,&local_1a4,"0",local_1c0,"licenseInfos.size()");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_c8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0xba);
  pAVar2 = license::EventRegistry::getLastFailure(&registry);
  local_1c0[0] = CONCAT71(local_1c0[0]._1_7_,pAVar2->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED)
  ;
  local_1c0[1] = 0;
  sStack_1b0.pi_ = (sp_counted_base *)0x0;
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_001e22d0;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = "Error detected";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&licenseInfos);
  license::locate::EnvironmentVarLocation::~EnvironmentVarLocation(&environmentVarLocation);
  license::EventRegistry::~EventRegistry(&registry);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(environment_var_location_not_defined) {
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
	license::EventRegistry registry;
	EnvironmentVarLocation environmentVarLocation;
	vector<string> licenseInfos = environmentVarLocation.license_locations(registry);

	BOOST_CHECK_MESSAGE(registry.isGood(), "No fatal error for now, only warnings");
	registry.turnWarningsIntoErrors();
	BOOST_REQUIRE_MESSAGE(!registry.isGood(), "Error detected");
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_CHECK_MESSAGE(registry.getLastFailure()->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED, "Error detected");
}